

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::CommittedShaderResources::Set
          (CommittedShaderResources *this,Uint32 Index,ShaderResourceBindingImplType *pSRB)

{
  byte bVar1;
  __int_type_conflict1 _Var2;
  char (*in_RCX) [32];
  ShaderResourceCacheImplType *pSVar3;
  string msg;
  
  if (7 < Index) {
    FormatString<char[26],char[32]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x2c3bbe,in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Set",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x182);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (pSRB == (ShaderResourceBindingImplType *)0x0) {
    (this->ResourceCaches)._M_elems[Index] = (ShaderResourceCacheGL *)0x0;
    bVar1 = ~(byte)(1 << ((byte)Index & 0x1f));
    this->StaleSRBMask = this->StaleSRBMask & bVar1;
    pSVar3 = (ShaderResourceCacheImplType *)0x0;
  }
  else {
    pSVar3 = &(pSRB->super_ShaderResourceBindingBase<Diligent::EngineGLImplTraits>).
              m_ShaderResourceCache;
    (this->ResourceCaches)._M_elems[Index] = pSVar3;
    bVar1 = (byte)(1 << ((byte)Index & 0x1f));
    this->StaleSRBMask = this->StaleSRBMask | bVar1;
    if ((pSRB->super_ShaderResourceBindingBase<Diligent::EngineGLImplTraits>).m_ShaderResourceCache.
        m_DynamicSSBOMask != 0 ||
        (pSRB->super_ShaderResourceBindingBase<Diligent::EngineGLImplTraits>).m_ShaderResourceCache.
        m_DynamicUBOMask != 0) {
      this->DynamicSRBMask = this->DynamicSRBMask | bVar1;
      goto LAB_00136d54;
    }
    bVar1 = ~bVar1;
  }
  this->DynamicSRBMask = this->DynamicSRBMask & bVar1;
LAB_00136d54:
  RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl>::operator=
            ((this->SRBs)._M_elems + Index,pSRB);
  if (pSRB == (ShaderResourceBindingImplType *)0x0) {
    _Var2 = 0;
  }
  else {
    this->ResourcesValidated = false;
    _Var2 = (pSVar3->super_ShaderResourceCacheBase).m_DvpRevision.super___atomic_base<unsigned_int>.
            _M_i;
  }
  (this->CacheRevisions)._M_elems[Index] = _Var2;
  return;
}

Assistant:

void Set(Uint32 Index, ShaderResourceBindingImplType* pSRB)
        {
            VERIFY_EXPR(Index < MAX_RESOURCE_SIGNATURES);
            ShaderResourceCacheImplType* pResourceCache = pSRB != nullptr ? &pSRB->GetResourceCache() : nullptr;
            ResourceCaches[Index]                       = pResourceCache;

            const SRBMaskType SRBBit = static_cast<SRBMaskType>(1u << Index);
            if (pResourceCache != nullptr)
                StaleSRBMask |= SRBBit;
            else
                StaleSRBMask &= ~SRBBit;

            if (pResourceCache != nullptr && pResourceCache->HasDynamicResources())
                DynamicSRBMask |= SRBBit;
            else
                DynamicSRBMask &= ~SRBBit;

#ifdef DILIGENT_DEVELOPMENT
            SRBs[Index] = pSRB;
            if (pSRB != nullptr)
                ResourcesValidated = false;
            CacheRevisions[Index] = pResourceCache != nullptr ? pResourceCache->DvpGetRevision() : 0;
#endif
        }